

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

SQChar * __thiscall
SQFunctionProto::GetLocal
          (SQFunctionProto *this,SQVM *vm,SQUnsignedInteger stackbase,SQUnsignedInteger nseq,
          SQUnsignedInteger nop)

{
  SQLocalVarInfo *pSVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = this->_nlocalvarinfos;
  if (uVar2 != 0 && nseq <= uVar2) {
    pSVar1 = this->_localvarinfos;
    lVar3 = 0;
    do {
      if ((*(ulong *)((long)&pSVar1->_start_op + lVar3) <= nop) &&
         (nop <= *(ulong *)((long)&pSVar1->_end_op + lVar3))) {
        if (nseq == 0) {
          SQVM::Push(vm,(vm->_stack)._vals + *(long *)((long)&pSVar1->_pos + lVar3) + stackbase);
          return (SQChar *)
                 (*(long *)((long)&(this->_localvarinfos->_name).super_SQObject._unVal + lVar3) +
                 0x38);
        }
        nseq = nseq - 1;
      }
      lVar3 = lVar3 + 0x28;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return (SQChar *)0x0;
}

Assistant:

const SQChar* SQFunctionProto::GetLocal(SQVM *vm,SQUnsignedInteger stackbase,SQUnsignedInteger nseq,SQUnsignedInteger nop)
{
    SQUnsignedInteger nvars=_nlocalvarinfos;
    const SQChar *res=NULL;
    if(nvars>=nseq){
        for(SQUnsignedInteger i=0;i<nvars;i++){
            if(_localvarinfos[i]._start_op<=nop && _localvarinfos[i]._end_op>=nop)
            {
                if(nseq==0){
                    vm->Push(vm->_stack[stackbase+_localvarinfos[i]._pos]);
                    res=_stringval(_localvarinfos[i]._name);
                    break;
                }
                nseq--;
            }
        }
    }
    return res;
}